

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::Utils::Program::GetActiveUniformsiv
          (Program *this,GLsizei count,GLuint *indices,GLenum pname,GLint *params)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  GetActiveUniformsiv((Functions *)CONCAT44(extraout_var,iVar1),this->m_id,count,indices,pname,
                      params);
  return;
}

Assistant:

void Program::GetActiveUniformsiv(GLsizei count, const GLuint* indices, GLenum pname, GLint* params) const
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	GetActiveUniformsiv(gl, m_id, count, indices, pname, params);
}